

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O2

void __thiscall
TPZPrInteg<TPZIntPrism3D>::GetOrder(TPZPrInteg<TPZIntPrism3D> *this,TPZVec<int> *ord)

{
  int iVar1;
  int *piVar2;
  
  if (ord->fNElements < 4) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
                   );
    return;
  }
  piVar2 = ord->fStore;
  *piVar2 = (this->super_TPZIntPrism3D).fOrdKsi;
  iVar1 = (this->super_TPZIntPrism3D).fOrdKti;
  piVar2[1] = iVar1;
  piVar2[2] = iVar1;
  piVar2[3] = this->fOrdKsi;
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }